

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3FindFunctionMethod
              (sqlite3_vtab *pVtab,int nArg,char *zName,
              _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr **pxFunc,void **ppArg)

{
  int iVar1;
  int local_7c;
  int i;
  Overloaded aOverload [4];
  void **ppArg_local;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr **pxFunc_local;
  char *zName_local;
  int nArg_local;
  sqlite3_vtab *pVtab_local;
  
  aOverload[3].xFunc = (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)ppArg;
  memcpy(&stack0xffffffffffffff88,&PTR_anon_var_dwarf_1b05d_0025aa40,0x40);
  local_7c = 0;
  while( true ) {
    if (3 < local_7c) {
      return 0;
    }
    iVar1 = strcmp(zName,*(char **)(&stack0xffffffffffffff88 + (long)local_7c * 0x10));
    if (iVar1 == 0) break;
    local_7c = local_7c + 1;
  }
  *pxFunc = (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)aOverload[local_7c].zName;
  return 1;
}

Assistant:

static int fts3FindFunctionMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  int nArg,                       /* Number of SQL function arguments */
  const char *zName,              /* Name of SQL function */
  void (**pxFunc)(sqlite3_context*,int,sqlite3_value**), /* OUT: Result */
  void **ppArg                    /* Unused */
){
  struct Overloaded {
    const char *zName;
    void (*xFunc)(sqlite3_context*,int,sqlite3_value**);
  } aOverload[] = {
    { "snippet", fts3SnippetFunc },
    { "offsets", fts3OffsetsFunc },
    { "optimize", fts3OptimizeFunc },
    { "matchinfo", fts3MatchinfoFunc },
  };
  int i;                          /* Iterator variable */

  UNUSED_PARAMETER(pVtab);
  UNUSED_PARAMETER(nArg);
  UNUSED_PARAMETER(ppArg);

  for(i=0; i<SizeofArray(aOverload); i++){
    if( strcmp(zName, aOverload[i].zName)==0 ){
      *pxFunc = aOverload[i].xFunc;
      return 1;
    }
  }

  /* No function of the specified name was found. Return 0. */
  return 0;
}